

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::rrb_details::rrb_drop_left<int,false,6>
          (rrb_details *this,ref<immutable::rrb<int,_false,_6>_> *in,uint32_t left)

{
  ref<immutable::rrb_details::tree_node<int,_false>_> *prVar1;
  leaf_node<int,_false> *plVar2;
  tree_node<int,_false> *ptVar3;
  int *piVar4;
  rrb<int,_false,_6> *temp_2;
  rrb<int,_false,_6> *prVar5;
  undefined8 *puVar6;
  node_type *pnVar7;
  rrb<int,_false,_6> *prVar8;
  ref<immutable::rrb<int,_false,_6>_> rVar9;
  ulong uVar10;
  ulong uVar11;
  char *__function;
  uint uVar12;
  uint uVar13;
  node_type nVar14;
  uint32_t uVar15;
  ref<immutable::rrb<int,_false,_6>_> new_rrb;
  ref<immutable::rrb_details::tree_node<int,_false>_> temp;
  ref<immutable::rrb<int,_false,_6>_> local_70;
  ref<immutable::rrb<int,_false,_6>_> local_68;
  node_type local_5c;
  rrb<int,_false,_6> *local_58;
  ref<immutable::rrb<int,_false,_6>_> *local_50;
  ref<immutable::rrb_details::tree_node<int,_false>_> *local_48;
  ulong local_40;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_38;
  
  prVar5 = in->ptr;
  if (prVar5 != (rrb<int,_false,_6> *)0x0) {
    uVar12 = prVar5->cnt;
    nVar14 = uVar12 - left;
    if (uVar12 < left || nVar14 == LEAF_NODE) {
      puVar6 = (undefined8 *)malloc(0x28);
      *puVar6 = 0;
      *(undefined4 *)(puVar6 + 1) = 0;
      puVar6[2] = 0;
      puVar6[3] = 0;
      local_68.ptr = (rrb<int,_false,_6> *)malloc(0x18);
      (local_68.ptr)->cnt = 0;
      (local_68.ptr)->shift = 0;
      ((local_68.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
      *(undefined4 *)&(local_68.ptr)->field_0xc = 0;
      (local_68.ptr)->tail_len = 1;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(puVar6 + 2),
                 (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_68);
      if ((local_68.ptr != (rrb<int,_false,_6> *)0x0) &&
         (uVar15 = (local_68.ptr)->tail_len, (local_68.ptr)->tail_len = uVar15 - 1, uVar15 == 1)) {
        free(local_68.ptr);
      }
      *(undefined8 **)this = puVar6;
      *(undefined4 *)(puVar6 + 4) = 1;
      return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
    }
    if (left != 0) {
      local_48 = (ref<immutable::rrb_details::tree_node<int,_false>_> *)
                 CONCAT44(local_48._4_4_,prVar5->tail_len);
      local_58 = (rrb<int,_false,_6> *)this;
      if (prVar5->tail_len < nVar14) {
        prVar5 = (rrb<int,_false,_6> *)malloc(0x28);
        prVar5->cnt = 0;
        prVar5->shift = 0;
        prVar5->tail_len = 0;
        (prVar5->tail).ptr = (leaf_node<int,_false> *)0x0;
        (prVar5->root).ptr = (tree_node<int,_false> *)0x0;
        local_68.ptr = (rrb<int,_false,_6> *)malloc(0x18);
        (local_68.ptr)->cnt = 0;
        (local_68.ptr)->shift = 0;
        ((local_68.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
        *(guid_type *)&(local_68.ptr)->field_0xc = 0;
        (local_68.ptr)->tail_len = 1;
        ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                  (&prVar5->tail,(ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_68);
        if ((local_68.ptr != (rrb<int,_false,_6> *)0x0) &&
           (uVar15 = (local_68.ptr)->tail_len, (local_68.ptr)->tail_len = uVar15 - 1, uVar15 == 1))
        {
          free(local_68.ptr);
        }
        this = (rrb_details *)local_58;
        prVar5->_ref_count = 1;
        prVar8 = in->ptr;
        local_70.ptr = prVar5;
        if (prVar8 != (rrb<int,_false,_6> *)0x0) {
          rrb_drop_left_rec<int,false,6>
                    ((rrb_details *)&local_68,&prVar5->shift,&prVar8->root,left,prVar8->shift,false)
          ;
          rVar9.ptr = local_68.ptr;
          if (local_68.ptr != (rrb<int,_false,_6> *)0x0) {
            (local_68.ptr)->tail_len = (local_68.ptr)->tail_len + 1;
          }
          ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                    ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_68);
          if (local_70.ptr != (rrb<int,_false,_6> *)0x0) {
            (local_70.ptr)->cnt = nVar14;
            if (rVar9.ptr != (rrb<int,_false,_6> *)0x0) {
              (rVar9.ptr)->tail_len = (rVar9.ptr)->tail_len + 1;
            }
            local_68.ptr = (rrb<int,_false,_6> *)((local_70.ptr)->root).ptr;
            ((local_70.ptr)->root).ptr = (tree_node<int,_false> *)rVar9.ptr;
            ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                      ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_68);
            if (local_70.ptr != (rrb<int,_false,_6> *)0x0) {
              if ((local_70.ptr)->shift != 0) {
                if (rVar9.ptr == (rrb<int,_false,_6> *)0x0) {
                  __function = 
                  "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
                  ;
                  goto LAB_0014cefa;
                }
                plVar2 = ((rVar9.ptr)->tail).ptr;
                if (plVar2 != (leaf_node<int,_false> *)0x0) {
                  if (in->ptr == (rrb<int,_false,_6> *)0x0) goto LAB_0014cee5;
                  *(uint32_t *)(*(long *)plVar2 + (ulong)((rVar9.ptr)->shift - 1) * 4) =
                       (local_70.ptr)->cnt - in->ptr->tail_len;
                }
              }
              if (in->ptr != (rrb<int,_false,_6> *)0x0) {
                ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                          (&(local_70.ptr)->tail,&in->ptr->tail);
                prVar5 = in->ptr;
                if ((prVar5 != (rrb<int,_false,_6> *)0x0) &&
                   (local_70.ptr != (rrb<int,_false,_6> *)0x0)) {
                  (local_70.ptr)->tail_len = prVar5->tail_len;
                  (local_70.ptr)->_ref_count = (local_70.ptr)->_ref_count + 1;
                  in->ptr = (rrb<int,_false,_6> *)local_70;
                  local_68.ptr = prVar5;
                  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_68);
                  release<int>((internal_node<int,_false> *)rVar9.ptr);
                  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_70);
                  goto LAB_0014cb73;
                }
              }
            }
          }
        }
        goto LAB_0014cee5;
      }
      uVar11 = (ulong)nVar14;
      local_50 = in;
      local_70.ptr = (rrb<int,_false,_6> *)malloc(uVar11 * 4 + 0x18);
      (local_70.ptr)->shift = nVar14;
      (local_70.ptr)->cnt = LEAF_NODE;
      prVar1 = &(local_70.ptr)->root;
      ((local_70.ptr)->tail).ptr = (leaf_node<int,_false> *)prVar1;
      *(guid_type *)&(local_70.ptr)->field_0xc = 0;
      local_5c = nVar14;
      if (uVar12 != left) {
        memset(prVar1,0,uVar11 * 4);
      }
      this = (rrb_details *)local_58;
      (local_70.ptr)->tail_len = 1;
      if (uVar12 != left) {
        plVar2 = (prVar5->tail).ptr;
        if (plVar2 == (leaf_node<int,_false> *)0x0) {
LAB_0014cf04:
          __function = 
          "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
          ;
          goto LAB_0014cefa;
        }
        piVar4 = plVar2->child;
        uVar10 = 0;
        do {
          *(int *)((long)&prVar1->ptr + uVar10 * 4) =
               piVar4[(left - uVar12) + (int)uVar10 + prVar5->tail_len];
          uVar10 = uVar10 + 1;
        } while (uVar11 != uVar10);
      }
      pnVar7 = (node_type *)malloc(0x28);
      pnVar7[0] = LEAF_NODE;
      pnVar7[1] = LEAF_NODE;
      pnVar7[2] = LEAF_NODE;
      pnVar7[4] = LEAF_NODE;
      pnVar7[5] = LEAF_NODE;
      pnVar7[6] = LEAF_NODE;
      pnVar7[7] = LEAF_NODE;
      local_68.ptr = (rrb<int,_false,_6> *)malloc(0x18);
      (local_68.ptr)->cnt = 0;
      (local_68.ptr)->shift = 0;
      ((local_68.ptr)->tail).ptr = (leaf_node<int,_false> *)0x0;
      *(guid_type *)&(local_68.ptr)->field_0xc = 0;
      (local_68.ptr)->tail_len = 1;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(pnVar7 + 4),
                 (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_68);
      in = local_50;
      if ((local_68.ptr != (rrb<int,_false,_6> *)0x0) &&
         (uVar15 = (local_68.ptr)->tail_len, (local_68.ptr)->tail_len = uVar15 - 1, uVar15 == 1)) {
        free(local_68.ptr);
      }
      *(node_type **)this = pnVar7;
      pnVar7[8] = INTERNAL_NODE;
      *pnVar7 = local_5c;
      pnVar7[2] = local_5c;
      ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                ((ref<immutable::rrb_details::leaf_node<int,_false>_> *)(pnVar7 + 4),
                 (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_70);
      nVar14 = local_5c;
      if ((local_70.ptr != (rrb<int,_false,_6> *)0x0) &&
         (uVar15 = (local_70.ptr)->tail_len, (local_70.ptr)->tail_len = uVar15 - 1, uVar15 == 1)) {
        free(local_70.ptr);
        nVar14 = local_5c;
      }
LAB_0014cb73:
      if (nVar14 <= (node_type)local_48) {
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
    }
    prVar5 = in->ptr;
    if (prVar5 != (rrb<int,_false,_6> *)0x0) {
      if ((prVar5->shift != 0) ||
         (ptVar3 = (prVar5->root).ptr, ptVar3 == (tree_node<int,_false> *)0x0)) {
LAB_0014cb8c:
        prVar5 = in->ptr;
        *(rrb<int,_false,_6> **)this = prVar5;
        if (prVar5 != (rrb<int,_false,_6> *)0x0) {
          prVar5->_ref_count = prVar5->_ref_count + 1;
        }
        return (ref<immutable::rrb<int,_false,_6>_>)(rrb<int,_false,_6> *)this;
      }
      if (prVar5->cnt < 0x41) {
        uVar12 = prVar5->cnt;
        uVar11 = (ulong)uVar12;
        prVar8 = (rrb<int,_false,_6> *)malloc(uVar11 * 4 + 0x18);
        prVar1 = &prVar8->root;
        prVar8->shift = uVar12;
        prVar8->cnt = LEAF_NODE;
        (prVar8->tail).ptr = (leaf_node<int,_false> *)prVar1;
        *(guid_type *)&prVar8->field_0xc = 0;
        if (uVar11 != 0) {
          memset(prVar1,0,uVar11 << 2);
        }
        prVar8->tail_len = 1;
        ptVar3 = (prVar5->root).ptr;
        local_70.ptr = prVar8;
        if (ptVar3 != (tree_node<int,_false> *)0x0) {
          uVar11 = 0;
LAB_0014cc20:
          if (uVar11 < ptVar3->len) goto code_r0x0014cc2c;
          if (prVar5->tail_len == 0) goto LAB_0014cd8c;
          plVar2 = (prVar5->tail).ptr;
          if (plVar2 != (leaf_node<int,_false> *)0x0) {
            piVar4 = plVar2->child;
            uVar11 = 0;
            do {
              *(int *)((long)&prVar1->ptr + (ulong)(ptVar3->len + (int)uVar11) * 4) = piVar4[uVar11]
              ;
              uVar11 = uVar11 + 1;
            } while (uVar11 < prVar5->tail_len);
LAB_0014cd8c:
            prVar5->tail_len = prVar5->cnt;
            local_38.ptr = (tree_node<int,_false> *)0x0;
            local_68.ptr = (rrb<int,_false,_6> *)(prVar5->root).ptr;
            (prVar5->root).ptr = (tree_node<int,_false> *)0x0;
            ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                      ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_68);
            ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_38);
            if (in->ptr != (rrb<int,_false,_6> *)0x0) {
              ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                        (&in->ptr->tail,
                         (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_70);
              if (local_70.ptr != (rrb<int,_false,_6> *)0x0) {
                uVar15 = (local_70.ptr)->tail_len;
                (local_70.ptr)->tail_len = uVar15 - 1;
                rVar9.ptr = local_70.ptr;
joined_r0x0014ced2:
                if (uVar15 == 1) {
                  free(rVar9.ptr);
                }
              }
              goto LAB_0014cb8c;
            }
            goto LAB_0014cee5;
          }
          goto LAB_0014cf04;
        }
      }
      else {
        if (0x3f < prVar5->cnt - prVar5->tail_len) goto LAB_0014cb8c;
        local_5c = ptVar3->len;
        uVar12 = 0x40 - local_5c;
        local_58 = (rrb<int,_false,_6> *)this;
        local_50 = in;
        rVar9.ptr = (rrb<int,_false,_6> *)malloc(0x118);
        (rVar9.ptr)->cnt = 0;
        (rVar9.ptr)->shift = 0x40;
        local_48 = &(rVar9.ptr)->root;
        ((rVar9.ptr)->tail).ptr = (leaf_node<int,_false> *)local_48;
        *(guid_type *)&(rVar9.ptr)->field_0xc = 0;
        memset(local_48,0,0x100);
        (rVar9.ptr)->tail_len = 1;
        uVar15 = prVar5->tail_len;
        local_40 = (ulong)(uVar15 - uVar12);
        prVar8 = (rrb<int,_false,_6> *)malloc(local_40 * 4 + 0x18);
        prVar1 = &prVar8->root;
        uVar15 = uVar15 - uVar12;
        prVar8->shift = uVar15;
        prVar8->cnt = LEAF_NODE;
        (prVar8->tail).ptr = (leaf_node<int,_false> *)prVar1;
        *(guid_type *)&prVar8->field_0xc = 0;
        if (uVar15 != 0) {
          memset(prVar1,0,local_40 << 2);
        }
        in = local_50;
        prVar8->tail_len = 1;
        ptVar3 = (prVar5->root).ptr;
        local_70.ptr = prVar8;
        if (ptVar3 != (tree_node<int,_false> *)0x0) {
          uVar11 = 0;
LAB_0014cd20:
          if (uVar11 < ptVar3->len) goto code_r0x0014cd2c;
          if (local_5c == 0x40) goto LAB_0014ce30;
          plVar2 = (prVar5->tail).ptr;
          if (plVar2 != (leaf_node<int,_false> *)0x0) {
            piVar4 = plVar2->child;
            uVar11 = 0;
            do {
              *(int *)((long)&local_48->ptr + (ulong)(ptVar3->len + (int)uVar11) * 4) =
                   piVar4[uVar11];
              uVar11 = uVar11 + 1;
            } while (uVar12 != uVar11);
LAB_0014ce30:
            uVar13 = prVar5->tail_len - uVar12;
            if (uVar13 != 0) {
              plVar2 = (prVar5->tail).ptr;
              if (plVar2 != (leaf_node<int,_false> *)0x0) {
                piVar4 = plVar2->child;
                uVar11 = 0;
                do {
                  *(int *)((long)&prVar1->ptr + uVar11 * 4) = piVar4[uVar12 + (int)uVar11];
                  uVar11 = uVar11 + 1;
                  uVar13 = prVar5->tail_len - uVar12;
                } while (uVar11 < uVar13);
                goto LAB_0014ce66;
              }
              goto LAB_0014cf04;
            }
LAB_0014ce66:
            prVar5->tail_len = uVar13;
            ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=
                      (&prVar5->tail,
                       (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_70);
            this = (rrb_details *)local_58;
            prVar5 = in->ptr;
            if (prVar5 != (rrb<int,_false,_6> *)0x0) {
              (rVar9.ptr)->tail_len = (rVar9.ptr)->tail_len + 1;
              local_68.ptr = (rrb<int,_false,_6> *)(prVar5->root).ptr;
              (prVar5->root).ptr = (tree_node<int,_false> *)rVar9.ptr;
              ref<immutable::rrb_details::tree_node<int,_false>_>::~ref
                        ((ref<immutable::rrb_details::tree_node<int,_false>_> *)&local_68);
              if ((local_70.ptr != (rrb<int,_false,_6> *)0x0) &&
                 (uVar15 = (local_70.ptr)->tail_len, (local_70.ptr)->tail_len = uVar15 - 1,
                 uVar15 == 1)) {
                free(local_70.ptr);
              }
              uVar15 = (rVar9.ptr)->tail_len;
              (rVar9.ptr)->tail_len = uVar15 - 1;
              goto joined_r0x0014ced2;
            }
            goto LAB_0014cee5;
          }
          goto LAB_0014cf04;
        }
      }
LAB_0014cd40:
      __function = 
      "T *immutable::ref<immutable::rrb_details::tree_node<int, false>>::operator->() const [T = immutable::rrb_details::tree_node<int, false>]"
      ;
      goto LAB_0014cefa;
    }
  }
LAB_0014cee5:
  __function = 
  "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
  ;
LAB_0014cefa:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
code_r0x0014cd2c:
  *(undefined4 *)((long)&((rVar9.ptr)->root).ptr + uVar11 * 4) =
       *(undefined4 *)(*(long *)(ptVar3 + 1) + uVar11 * 4);
  uVar11 = uVar11 + 1;
  if (ptVar3 == (tree_node<int,_false> *)0x0) goto LAB_0014cd40;
  goto LAB_0014cd20;
code_r0x0014cc2c:
  *(undefined4 *)((long)&prVar1->ptr + uVar11 * 4) =
       *(undefined4 *)(*(long *)(ptVar3 + 1) + uVar11 * 4);
  uVar11 = uVar11 + 1;
  if (ptVar3 == (tree_node<int,_false> *)0x0) goto LAB_0014cd40;
  goto LAB_0014cc20;
}

Assistant:

T* ref<T>::operator->() const
      {
      assert(ptr != nullptr);
      return ptr;
      }